

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QGraphicsItem_*>::squeeze(QList<QGraphicsItem_*> *this)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QGraphicsItem_*> *this_00;
  DataOps *pDVar3;
  QArrayDataPointer<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffff98;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffffa0;
  QGraphicsItem **in_stack_ffffffffffffffa8;
  QFlagsStorage<QArrayData::ArrayOption> f;
  qsizetype in_stack_ffffffffffffffb0;
  qsizetype in_stack_ffffffffffffffb8;
  QArrayDataPointer<QGraphicsItem_*> *in_stack_ffffffffffffffc0;
  QArrayDataPointer<QGraphicsItem_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QGraphicsItem_*>::isMutable(in_RDI);
  if (!bVar1) goto LAB_009dd1a6;
  QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGraphicsItem_*>::needsDetach(in_stack_ffffffffffffffa0);
  if (bVar1) {
LAB_009dd063:
    local_20.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_20.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    size((QList<QGraphicsItem_*> *)in_RDI);
    QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (AllocationOption)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    qVar2 = size((QList<QGraphicsItem_*> *)in_RDI);
    if (qVar2 != 0) {
      bVar1 = QArrayDataPointer<QGraphicsItem_*>::needsDetach(in_stack_ffffffffffffffa0);
      if (bVar1) {
        this_00 = (QPodArrayOps<QGraphicsItem_*> *)
                  QArrayDataPointer<QGraphicsItem_*>::operator->(&local_20);
        QArrayDataPointer<QGraphicsItem_*>::data(in_RDI);
        QArrayDataPointer<QGraphicsItem_*>::data(in_RDI);
        QtPrivate::QPodArrayOps<QGraphicsItem_*>::copyAppend
                  (this_00,in_stack_ffffffffffffffa8,(QGraphicsItem **)in_stack_ffffffffffffffa0);
      }
      else {
        in_stack_ffffffffffffffa0 =
             (QArrayDataPointer<QGraphicsItem_*> *)
             QArrayDataPointer<QGraphicsItem_*>::operator->(&local_20);
        in_stack_ffffffffffffffa8 = QArrayDataPointer<QGraphicsItem_*>::data(in_RDI);
        QArrayDataPointer<QGraphicsItem_*>::data(in_RDI);
        QtPrivate::QPodArrayOps<QGraphicsItem_*>::moveAppend
                  ((QPodArrayOps<QGraphicsItem_*> *)in_stack_ffffffffffffffa0,
                   (QGraphicsItem **)in_stack_ffffffffffffff98,(QGraphicsItem **)0x9dd161);
      }
    }
    QArrayDataPointer<QGraphicsItem_*>::swap(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    in_stack_ffffffffffffffc0 =
         (QArrayDataPointer<QGraphicsItem_*> *)size((QList<QGraphicsItem_*> *)in_RDI);
    qVar2 = capacity((QList<QGraphicsItem_*> *)0x9dd052);
    if ((long)in_stack_ffffffffffffffc0 < qVar2) goto LAB_009dd063;
  }
  f.i = (Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pDVar3 = QArrayDataPointer<QGraphicsItem_*>::operator->(in_RDI);
  QFlags<QArrayData::ArrayOption>::QFlags
            ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffffa0,
             (ArrayOption)((ulong)pDVar3 >> 0x20));
  QArrayDataPointer<QGraphicsItem_*>::clearFlag(in_stack_ffffffffffffffa0,(ArrayOptions)f.i);
LAB_009dd1a6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}